

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O2

void __thiscall
cmsys::CommandLineArguments::GetRemainingArguments
          (CommandLineArguments *this,int *argc,char ***argv)

{
  Internal *pIVar1;
  size_type sVar2;
  long lVar3;
  char **ppcVar4;
  char *pcVar5;
  long lVar6;
  long *plVar7;
  ulong uVar8;
  
  pIVar1 = this->Internals;
  lVar6 = (long)(pIVar1->Argv).super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                super__Vector_impl_data._M_start;
  uVar8 = (long)(pIVar1->Argv).super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                super__Vector_impl_data._M_finish - lVar6 >> 5;
  sVar2 = pIVar1->LastArgument;
  lVar3 = uVar8 - sVar2;
  ppcVar4 = (char **)operator_new__(-(ulong)(lVar3 + 1U >> 0x3d != 0) | lVar3 * 8 + 8U);
  pcVar5 = (char *)operator_new__((pIVar1->Argv0).super_string._M_string_length + 1);
  *ppcVar4 = pcVar5;
  strcpy(pcVar5,(pIVar1->Argv0).super_string._M_dataplus._M_p);
  plVar7 = (long *)(lVar6 + sVar2 * 0x20 + 0x28);
  for (lVar6 = 1; lVar6 + sVar2 < uVar8; lVar6 = lVar6 + 1) {
    pcVar5 = (char *)operator_new__(*plVar7 + 1);
    ppcVar4[lVar6] = pcVar5;
    strcpy(pcVar5,(char *)plVar7[-1]);
    plVar7 = plVar7 + 4;
  }
  *argc = (int)lVar6;
  *argv = ppcVar4;
  return;
}

Assistant:

void CommandLineArguments::GetRemainingArguments(int* argc, char*** argv)
{
  CommandLineArguments::Internal::VectorOfStrings::size_type size =
    this->Internals->Argv.size() - this->Internals->LastArgument + 1;
  CommandLineArguments::Internal::VectorOfStrings::size_type cc;

  // Copy Argv0 as the first argument
  char** args = new char*[size];
  args[0] = new char[this->Internals->Argv0.size() + 1];
  strcpy(args[0], this->Internals->Argv0.c_str());
  int cnt = 1;

  // Copy everything after the LastArgument, since that was not parsed.
  for (cc = this->Internals->LastArgument + 1;
       cc < this->Internals->Argv.size(); cc++) {
    args[cnt] = new char[this->Internals->Argv[cc].size() + 1];
    strcpy(args[cnt], this->Internals->Argv[cc].c_str());
    cnt++;
  }
  *argc = cnt;
  *argv = args;
}